

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPhysicsItem.cpp
# Opt level: O1

void __thiscall chrono::ChPhysicsItem::GetCenter(ChPhysicsItem *this,ChVector<double> *mcenter)

{
  ChVector<double> mmax;
  ChVector<double> mmin;
  double local_58;
  double dStack_50;
  double local_48;
  double local_38;
  double dStack_30;
  double local_28;
  
  local_38 = 0.0;
  dStack_30 = 0.0;
  local_28 = 0.0;
  local_48 = 0.0;
  local_58 = 0.0;
  dStack_50 = 0.0;
  (*(this->super_ChObj)._vptr_ChObj[0xe])(this,&local_38,&local_58);
  mcenter->m_data[0] = (local_38 + local_58) * 0.5;
  mcenter->m_data[1] = (dStack_30 + dStack_50) * 0.5;
  mcenter->m_data[2] = (local_28 + local_48) * 0.5;
  return;
}

Assistant:

void ChPhysicsItem::GetCenter(ChVector<>& mcenter) {
    ChVector<> mmin, mmax;
    GetTotalAABB(mmin, mmax);
    mcenter = (mmin + mmax) * 0.5;
}